

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O0

REF_STATUS
ref_grid_cell_id_nodes
          (REF_GRID ref_grid,REF_CELL ref_cell,REF_INT cell_id,REF_INT *nnode,REF_INT *ncell,
          REF_INT **g2l,REF_INT **l2g)

{
  REF_NODE pRVar1;
  REF_STATUS RVar2;
  REF_INT *pRVar3;
  int local_cc;
  REF_INT local_c8;
  REF_INT ref_malloc_init_i;
  REF_INT nodes [27];
  int local_54;
  int local_50;
  REF_INT cell_node;
  REF_INT node;
  REF_INT cell;
  REF_NODE ref_node;
  REF_INT **g2l_local;
  REF_INT *ncell_local;
  REF_INT *nnode_local;
  REF_INT cell_id_local;
  REF_CELL ref_cell_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->node;
  if (ref_cell->last_node_is_an_id == 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x1bf,
           "ref_grid_cell_id_nodes","ref_cell with id expected");
    ref_grid_local._4_4_ = 1;
  }
  else if (pRVar1->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x1c1,
           "ref_grid_cell_id_nodes","malloc *g2l of REF_INT negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    pRVar3 = (REF_INT *)malloc((long)pRVar1->max << 2);
    *g2l = pRVar3;
    if (*g2l == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x1c1,
             "ref_grid_cell_id_nodes","malloc *g2l of REF_INT NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      for (local_cc = 0; local_cc < pRVar1->max; local_cc = local_cc + 1) {
        (*g2l)[local_cc] = -1;
      }
      *nnode = 0;
      *ncell = 0;
      for (cell_node = 0; cell_node < ref_cell->max; cell_node = cell_node + 1) {
        RVar2 = ref_cell_nodes(ref_cell,cell_node,&local_c8);
        if ((RVar2 == 0) && (cell_id == (&local_c8)[ref_cell->node_per])) {
          *ncell = *ncell + 1;
          for (local_54 = 0; local_54 < ref_cell->node_per; local_54 = local_54 + 1) {
            if ((*g2l)[(&local_c8)[local_54]] == -1) {
              (*g2l)[(&local_c8)[local_54]] = *nnode;
              *nnode = *nnode + 1;
            }
          }
        }
      }
      if (*nnode < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               0x1d2,"ref_grid_cell_id_nodes","malloc *l2g of REF_INT negative");
        ref_grid_local._4_4_ = 1;
      }
      else {
        pRVar3 = (REF_INT *)malloc((long)*nnode << 2);
        *l2g = pRVar3;
        if (*l2g == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x1d2,"ref_grid_cell_id_nodes","malloc *l2g of REF_INT NULL");
          ref_grid_local._4_4_ = 2;
        }
        else {
          *nnode = 0;
          for (local_50 = 0; local_50 < pRVar1->max; local_50 = local_50 + 1) {
            if ((*g2l)[local_50] != -1) {
              (*g2l)[local_50] = *nnode;
              (*l2g)[*nnode] = local_50;
              *nnode = *nnode + 1;
            }
          }
          ref_grid_local._4_4_ = 0;
        }
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_grid_cell_id_nodes(REF_GRID ref_grid, REF_CELL ref_cell,
                                          REF_INT cell_id, REF_INT *nnode,
                                          REF_INT *ncell, REF_INT **g2l,
                                          REF_INT **l2g) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT cell, node, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  RAS(ref_cell_last_node_is_an_id(ref_cell), "ref_cell with id expected");

  ref_malloc_init(*g2l, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  (*nnode) = 0;
  (*ncell) = 0;

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (cell_id == nodes[ref_cell_id_index(ref_cell)]) {
      (*ncell)++;
      each_ref_cell_cell_node(ref_cell, cell_node) {
        if (REF_EMPTY == (*g2l)[nodes[cell_node]]) {
          (*g2l)[nodes[cell_node]] = (*nnode);
          (*nnode)++;
        }
      }
    }
  }

  ref_malloc(*l2g, *nnode, REF_INT);

  (*nnode) = 0;
  for (node = 0; node < ref_node_max(ref_node); node++) {
    if (REF_EMPTY != (*g2l)[node]) {
      (*g2l)[node] = (*nnode);
      (*l2g)[(*nnode)] = node;
      (*nnode)++;
    }
  }

  return REF_SUCCESS;
}